

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.h
# Opt level: O2

void __thiscall TestQueue::TestQueue(TestQueue *this)

{
  TestQueue **ppTVar1;
  
  this->_vptr_TestQueue = (_func_int **)&PTR__TestQueue_003c6340;
  this->next = (TestQueue *)0x0;
  ppTVar1 = &tail->next;
  if (head == (TestQueue *)0x0) {
    ppTVar1 = &head;
  }
  *ppTVar1 = this;
  tail = this;
  return;
}

Assistant:

TestQueue()
	{
		this->next = 0;
		if(!head)
		{
			head = tail = this;
		}else{
			tail->next = this;
			tail = this;
		}
	}